

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O3

bool __thiscall
soul::SourceCodeModel::rebuild
          (SourceCodeModel *this,CompileMessageList *errors,
          ArrayView<soul::RefCountedPtr<soul::SourceCodeText>_> filesToLoad)

{
  File *pFVar1;
  SourceCodeText *pSVar2;
  SourceCodeText *o;
  pointer pcVar3;
  string_view firstReplacement;
  undefined8 uVar4;
  pointer ppVar5;
  bool bVar6;
  CompileMessage *m;
  Namespace *parentNamespace;
  pointer pCVar7;
  long *plVar8;
  RefCountedPtr<soul::SourceCodeText> *pRVar9;
  Comment *summary;
  Comment *extraout_RDX;
  Comment *extraout_RDX_00;
  Comment *summary_00;
  File *this_00;
  pointer ppVar10;
  File *pFVar11;
  ulong uVar12;
  long in_FS_OFFSET;
  bool bVar13;
  string_view name;
  CompileMessageHandler handler;
  Allocator allocator;
  size_t in_stack_fffffffffffffe48;
  undefined1 local_1a8 [16];
  undefined1 auStack_198 [16];
  Ptr local_188;
  UTF8Reader local_180;
  Ptr local_178;
  UTF8Reader local_170;
  undefined1 local_168 [24];
  long lStack_150;
  Ptr local_140;
  Ptr local_138;
  size_type local_130;
  CompileMessageList *local_128;
  vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
  local_120;
  long *local_108 [2];
  long local_f8 [2];
  string *local_e8;
  ulong local_e0;
  SourceCodeModel *local_d8;
  string local_d0;
  CodeLocation local_b0;
  CodeLocation local_a0;
  Allocator local_90;
  
  pRVar9 = filesToLoad.s;
  pFVar11 = (this->files).
            super__Vector_base<soul::SourceCodeModel::File,_std::allocator<soul::SourceCodeModel::File>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pFVar1 = (this->files).
           super__Vector_base<soul::SourceCodeModel::File,_std::allocator<soul::SourceCodeModel::File>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = pFVar11;
  local_128 = errors;
  if (pFVar1 != pFVar11) {
    do {
      File::~File(this_00);
      this_00 = this_00 + 1;
    } while (this_00 != pFVar1);
    (this->files).
    super__Vector_base<soul::SourceCodeModel::File,_std::allocator<soul::SourceCodeModel::File>_>.
    _M_impl.super__Vector_impl_data._M_finish = pFVar11;
  }
  PoolAllocator::PoolAllocator(&local_90.pool);
  local_90.identifiers.strings.
  super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90.identifiers.strings.
  super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.identifiers.strings.
  super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90.stringDictionary.super_StringDictionary._vptr_StringDictionary =
       (_func_int **)&PTR__StringDictionary_002f5170;
  local_90.stringDictionary.strings.
  super__Vector_base<soul::StringDictionary::Item,_std::allocator<soul::StringDictionary::Item>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.stringDictionary.strings.
  super__Vector_base<soul::StringDictionary::Item,_std::allocator<soul::StringDictionary::Item>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90.stringDictionary.strings.
  super__Vector_base<soul::StringDictionary::Item,_std::allocator<soul::StringDictionary::Item>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90.stringDictionary.nextIndex = 1;
  parentNamespace = AST::createRootNamespace(&local_90);
  local_130 = (long)filesToLoad.e - (long)pRVar9 >> 3;
  std::vector<soul::SourceCodeModel::File,_std::allocator<soul::SourceCodeModel::File>_>::resize
            (&this->files,local_130);
  if (filesToLoad.e != pRVar9) {
    local_e0 = local_130 + (local_130 == 0);
    bVar13 = false;
    uVar12 = 0;
    local_d8 = this;
    do {
      pFVar11 = (local_d8->files).
                super__Vector_base<soul::SourceCodeModel::File,_std::allocator<soul::SourceCodeModel::File>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar12;
      auStack_198._8_8_ =
           std::
           _Function_handler<void_(const_soul::CompileMessageGroup_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/diagnostics/soul_CompileMessageList.cpp:200:30)>
           ::_M_invoke;
      local_1a8._0_8_ = local_128;
      local_1a8._8_8_ = (pointer)0x0;
      auStack_198._0_8_ =
           std::
           _Function_handler<void_(const_soul::CompileMessageGroup_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/diagnostics/soul_CompileMessageList.cpp:200:30)>
           ::_M_manager;
      local_188.object = *(SourceCodeText **)(in_FS_OFFSET + -8);
      *(undefined1 **)(in_FS_OFFSET + -8) = local_1a8;
      local_138.object = pRVar9[uVar12].object;
      if (local_138.object != (SourceCodeText *)0x0) {
        ((local_138.object)->super_RefCountedObject).refCount =
             ((local_138.object)->super_RefCountedObject).refCount + 1;
      }
      CodeLocation::CodeLocation(&local_a0,&local_138);
      Compiler::parseTopLevelDeclarations(&local_120,&local_90,&local_a0,parentNamespace);
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_a0.sourceCode.object);
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_138.object);
      ppVar5 = local_120.
               super__Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (ppVar10 = local_120.
                     super__Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; ppVar10 != ppVar5;
          ppVar10 = ppVar10 + 1) {
        do {
          bVar6 = ASTUtilities::mergeFirstPairOfDuplicateNamespaces(parentNamespace);
        } while (bVar6);
        recurseFindingModules(ppVar10->object,pFVar11,&local_90.stringDictionary);
      }
      if (local_120.
          super__Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_120.
                        super__Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_120.
                              super__Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_120.
                              super__Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      CompileMessageHandler::~CompileMessageHandler((CompileMessageHandler *)local_1a8);
      for (pCVar7 = (local_128->messages).
                    super__Vector_base<soul::CompileMessage,_std::allocator<soul::CompileMessage>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pCVar7 != (local_128->messages).
                    super__Vector_base<soul::CompileMessage,_std::allocator<soul::CompileMessage>_>.
                    _M_impl.super__Vector_impl_data._M_finish; pCVar7 = pCVar7 + 1) {
        if ((pCVar7->type & ~internalCompilerError) == error) goto LAB_001d07df;
      }
      pSVar2 = pRVar9[uVar12].object;
      if (pSVar2 != (SourceCodeText *)0x0) {
        (pSVar2->super_RefCountedObject).refCount = (pSVar2->super_RefCountedObject).refCount + 1;
      }
      o = (pFVar11->source).object;
      (pFVar11->source).object = pSVar2;
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(o);
      if (pRVar9[uVar12].object == (SourceCodeText *)0x0) {
        throwInternalCompilerError("object != nullptr","operator->",0x47);
      }
      local_e8 = &pFVar11->filename;
      std::__cxx11::string::_M_assign((string *)local_e8);
      local_108[0] = local_f8;
      pcVar3 = (pFVar11->filename)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_108,pcVar3,pcVar3 + (pFVar11->filename)._M_string_length);
      firstReplacement._M_str = (char *)pRVar9;
      firstReplacement._M_len = in_stack_fffffffffffffe48;
      choc::text::replace<std::__cxx11::string>
                (&local_d0,(text *)local_108,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5,
                 (string_view)ZEXT816(0x27dacb),firstReplacement);
      plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,0x27dac6);
      local_168._0_8_ = local_168 + 0x10;
      name._M_str = (pointer)(plVar8 + 2);
      if ((pointer)*plVar8 == name._M_str) {
        local_168._16_8_ = ((name._M_str)->description)._M_dataplus._M_p;
        lStack_150 = plVar8[3];
      }
      else {
        local_168._16_8_ = ((name._M_str)->description)._M_dataplus._M_p;
        local_168._0_8_ = (pointer)*plVar8;
      }
      local_168._8_8_ = plVar8[1];
      *plVar8 = (long)name._M_str;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      name._M_len = local_168._0_8_;
      makeUID_abi_cxx11_((string *)local_1a8,(soul *)local_168._8_8_,name);
      std::__cxx11::string::operator=((string *)&pFVar11->UID,(string *)local_1a8);
      if ((CompileMessageList *)local_1a8._0_8_ != (CompileMessageList *)auStack_198) {
        operator_delete((void *)local_1a8._0_8_,(ulong)(auStack_198._0_8_ + 1));
      }
      if ((pointer)local_168._0_8_ != (pointer)(local_168 + 0x10)) {
        operator_delete((void *)local_168._0_8_,
                        (ulong)((long)&((_Alloc_hider *)local_168._16_8_)->_M_p + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if (local_108[0] != local_f8) {
        operator_delete(local_108[0],local_f8[0] + 1);
      }
      local_140.object = pRVar9[uVar12].object;
      if (local_140.object != (SourceCodeText *)0x0) {
        ((local_140.object)->super_RefCountedObject).refCount =
             ((local_140.object)->super_RefCountedObject).refCount + 1;
      }
      CodeLocation::CodeLocation(&local_b0,&local_140);
      SourceCodeUtilities::getFileSummaryComment((Comment *)local_1a8,&local_b0);
      uVar4 = local_1a8._0_8_;
      (pFVar11->fileComment).valid = (bool)local_1a8[0];
      (pFVar11->fileComment).isStarSlash = (bool)local_1a8[1];
      (pFVar11->fileComment).isDoxygenStyle = (bool)local_1a8[2];
      (pFVar11->fileComment).isReferringBackwards = (bool)local_1a8[3];
      local_168._16_8_ =
           (pFVar11->fileComment).lines.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_168._0_8_ =
           (pFVar11->fileComment).lines.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_168._8_8_ =
           (pFVar11->fileComment).lines.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      (pFVar11->fileComment).lines.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_1a8._8_8_;
      (pFVar11->fileComment).lines.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)auStack_198._0_8_;
      (pFVar11->fileComment).lines.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)auStack_198._8_8_;
      local_1a8._8_8_ = (pointer)0x0;
      auStack_198._0_8_ = (pointer)0x0;
      auStack_198._8_8_ = (pointer)0x0;
      local_1a8._0_8_ = uVar4;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_168);
      pSVar2 = (pFVar11->fileComment).range.start.sourceCode.object;
      if (local_188.object != pSVar2) {
        (pFVar11->fileComment).range.start.sourceCode.object = local_188.object;
        local_188.object = (SourceCodeText *)0x0;
        RefCountedPtr<soul::SourceCodeText>::decIfNotNull(pSVar2);
      }
      (pFVar11->fileComment).range.start.location.data = local_180.data;
      pSVar2 = (pFVar11->fileComment).range.end.sourceCode.object;
      if (local_178.object != pSVar2) {
        (pFVar11->fileComment).range.end.sourceCode.object = local_178.object;
        local_178.object = (SourceCodeText *)0x0;
        RefCountedPtr<soul::SourceCodeText>::decIfNotNull(pSVar2);
      }
      (pFVar11->fileComment).range.end.location.data = local_170.data;
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_178.object);
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_188.object);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_1a8 + 8));
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_b0.sourceCode.object);
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_140.object);
      SourceCodeUtilities::getFileSummaryTitle_abi_cxx11_
                ((string *)local_1a8,(SourceCodeUtilities *)&pFVar11->fileComment,summary);
      std::__cxx11::string::operator=((string *)&pFVar11->title,(string *)local_1a8);
      summary_00 = extraout_RDX;
      if ((CompileMessageList *)local_1a8._0_8_ != (CompileMessageList *)auStack_198) {
        operator_delete((void *)local_1a8._0_8_,(ulong)(auStack_198._0_8_ + 1));
        summary_00 = extraout_RDX_00;
      }
      SourceCodeUtilities::getFileSummaryBody_abi_cxx11_
                ((string *)local_1a8,(SourceCodeUtilities *)&pFVar11->fileComment,summary_00);
      std::__cxx11::string::operator=((string *)&pFVar11->summary,(string *)local_1a8);
      if ((CompileMessageList *)local_1a8._0_8_ != (CompileMessageList *)auStack_198) {
        operator_delete((void *)local_1a8._0_8_,(ulong)(auStack_198._0_8_ + 1));
      }
      if ((pFVar11->title)._M_string_length == 0) {
        std::__cxx11::string::_M_assign((string *)&pFVar11->title);
      }
      uVar12 = uVar12 + 1;
      bVar13 = local_130 <= uVar12;
    } while (uVar12 != local_e0);
  }
  bVar13 = true;
LAB_001d07df:
  local_90.stringDictionary.super_StringDictionary._vptr_StringDictionary =
       (_func_int **)&PTR__StringDictionary_002f5170;
  std::vector<soul::StringDictionary::Item,_std::allocator<soul::StringDictionary::Item>_>::~vector
            (&local_90.stringDictionary.strings);
  std::
  vector<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(&local_90.identifiers.strings);
  std::
  vector<std::unique_ptr<soul::PoolAllocator::Pool,_std::default_delete<soul::PoolAllocator::Pool>_>,_std::allocator<std::unique_ptr<soul::PoolAllocator::Pool,_std::default_delete<soul::PoolAllocator::Pool>_>_>_>
  ::~vector((vector<std::unique_ptr<soul::PoolAllocator::Pool,_std::default_delete<soul::PoolAllocator::Pool>_>,_std::allocator<std::unique_ptr<soul::PoolAllocator::Pool,_std::default_delete<soul::PoolAllocator::Pool>_>_>_>
             *)&local_90);
  return bVar13;
}

Assistant:

bool SourceCodeModel::rebuild (CompileMessageList& errors, ArrayView<SourceCodeText::Ptr> filesToLoad)
{
    files.clear();
    AST::Allocator allocator;
    auto& topLevelNamespace = AST::createRootNamespace (allocator);

    files.resize (filesToLoad.size());

    for (size_t i = 0; i < filesToLoad.size(); ++i)
    {
        auto& f = filesToLoad[i];
        auto& desc = files[i];

        try
        {
            CompileMessageHandler handler (errors);

            for (auto& m : Compiler::parseTopLevelDeclarations (allocator, f, topLevelNamespace))
            {
                ASTUtilities::mergeDuplicateNamespaces (topLevelNamespace);
                recurseFindingModules (m, desc, allocator.stringDictionary);
            }
        }
        catch (AbortCompilationException) {}

        if (errors.hasErrors())
            return false;

        desc.source = f;
        desc.filename = f->filename;
        desc.UID = makeUID ("lib_" + choc::text::replace (desc.filename, ".soul", ""));
        desc.fileComment = SourceCodeUtilities::getFileSummaryComment (f);
        desc.title = SourceCodeUtilities::getFileSummaryTitle (desc.fileComment);
        desc.summary = SourceCodeUtilities::getFileSummaryBody (desc.fileComment);

        if (desc.title.empty())
            desc.title = desc.filename;
    }

    return true;
}